

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencc.c
# Opt level: O3

int opencc_dict_load(opencc_t t_opencc,char *dict_filename,opencc_dictionary_type dict_type)

{
  int iVar1;
  dictionary_group_t t_dictionary;
  dictionary_set_t t_dictionary_00;
  
  if (lib_initialized == '\0') {
    lib_initialized = '\x01';
  }
  if (*t_opencc == (dictionary_set_t)0x0) {
    t_dictionary_00 = dictionary_set_open();
    *(dictionary_set_t *)t_opencc = t_dictionary_00;
    t_dictionary = dictionary_set_new_group(t_dictionary_00);
  }
  else {
    t_dictionary = dictionary_set_get_group(*t_opencc,0);
  }
  iVar1 = dictionary_group_load(t_dictionary,dict_filename,dict_type);
  if (iVar1 == -1) {
    errnum = OPENCC_ERROR_DICTLOAD;
  }
  else {
    converter_assign_dictionary(*(converter_t *)((long)t_opencc + 8),*t_opencc);
  }
  return iVar1;
}

Assistant:

int opencc_dict_load(opencc_t t_opencc, const char * dict_filename,
		opencc_dictionary_type dict_type)
{
	if (!lib_initialized)
		lib_initialize();

	opencc_desc * opencc = (opencc_desc *) t_opencc;

	dictionary_group_t dictionary_group;
	if (opencc->dictionary_set == NULL)
	{
		opencc->dictionary_set = dictionary_set_open();
		dictionary_group = dictionary_set_new_group(opencc->dictionary_set);
	}
	else
	{
		dictionary_group = dictionary_set_get_group(opencc->dictionary_set, 0);
	}

	int retval;
	retval = dictionary_group_load(dictionary_group, dict_filename, dict_type);

	if (retval == -1)
	{
		errnum = OPENCC_ERROR_DICTLOAD;
		return -1;
	}

	converter_assign_dictionary(opencc->converter, opencc->dictionary_set);

	return retval;
}